

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# lua-crypt.c
# Opt level: O0

int lrandomkey(lua_State *L)

{
  long lVar1;
  byte local_1d;
  int local_1c;
  byte local_18 [3];
  char x;
  int i;
  char tmp [8];
  lua_State *L_local;
  
  local_1d = 0;
  tmp = (char  [8])L;
  for (local_1c = 0; local_1c < 8; local_1c = local_1c + 1) {
    lVar1 = random();
    local_18[local_1c] = (byte)lVar1;
    local_1d = local_1d ^ local_18[local_1c];
  }
  if (local_1d == 0) {
    local_18[0] = local_18[0] | 1;
  }
  lua_pushlstring((lua_State *)tmp,(char *)local_18,8);
  return 1;
}

Assistant:

static int
lrandomkey(lua_State *L) {
	char tmp[8];
	int i;
	char x = 0;
	for (i=0;i<8;i++) {
		tmp[i] = random() & 0xff;
		x ^= tmp[i];
	}
	if (x==0) {
		tmp[0] |= 1;	// avoid 0
	}
	lua_pushlstring(L, tmp, 8);
	return 1;
}